

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

uv_os_sock_t create_udp_socket(void)

{
  uint uVar1;
  int iVar2;
  uv_os_sock_t extraout_EAX;
  int iVar3;
  uv_os_sock_t uVar4;
  uint uVar5;
  uv_os_sock_t extraout_EAX_00;
  undefined8 uVar6;
  ulong uVar7;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  code **ppcVar8;
  code *pcVar9;
  undefined8 *puVar10;
  code **ppcVar11;
  long *plVar12;
  ulong in_R8;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  long lStack_678;
  long lStack_670;
  undefined1 auStack_668 [16];
  undefined1 auStack_656 [18];
  undefined8 uStack_644;
  undefined8 uStack_63c;
  undefined8 uStack_634;
  undefined8 uStack_62c;
  undefined8 uStack_624;
  undefined8 uStack_61c;
  undefined8 uStack_614;
  undefined8 uStack_60c;
  undefined8 uStack_604;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined8 uStack_5f0;
  undefined8 auStack_5e8 [23];
  long alStack_530 [41];
  ulong uStack_3e8;
  code *pcStack_3e0;
  long lStack_3d8;
  long lStack_3d0;
  undefined1 auStack_3c8 [16];
  sockaddr sStack_3b8;
  long alStack_3a8 [23];
  long alStack_2f0 [8];
  long lStack_2b0;
  code *pcStack_238;
  long lStack_228;
  long lStack_220;
  sockaddr sStack_218;
  long alStack_208 [23];
  code *pcStack_150;
  long lStack_148;
  long lStack_140;
  undefined1 auStack_138 [184];
  code **ppcStack_80;
  undefined8 *puStack_58;
  ulong uStack_50;
  code **ppcStack_48;
  undefined8 uStack_38;
  code *apcStack_30 [2];
  undefined8 local_20;
  long local_18;
  undefined4 local_c;
  
  apcStack_30[0] = (code *)0x1df4cd;
  uVar1 = socket(2,2,0);
  ppcVar8 = (code **)(ulong)uVar1;
  local_18 = (long)(int)uVar1;
  local_20 = 0;
  if (local_18 < 0) {
    apcStack_30[0] = (code *)0x1df540;
    create_udp_socket_cold_2();
  }
  else {
    in_RCX = &local_c;
    local_c = 1;
    in_R8 = 4;
    apcStack_30[0] = (code *)0x1df50d;
    iVar2 = setsockopt(uVar1,1,2,in_RCX,4);
    local_18 = (long)iVar2;
    local_20 = 0;
    if (local_18 == 0) {
      return uVar1;
    }
  }
  pcVar9 = (code *)&local_20;
  apcStack_30[0] = alloc_cb;
  create_udp_socket_cold_1();
  uStack_38 = 0x10000;
  if ((long)pcVar9 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0xfed960;
  }
  ppcVar11 = apcStack_30;
  puVar10 = &uStack_38;
  ppcStack_48 = (code **)recv_cb;
  apcStack_30[0] = pcVar9;
  alloc_cb_cold_1();
  iVar2 = (int)&puStack_58;
  ppcStack_48 = ppcVar8;
  if ((long)puVar10 < 0) {
    recv_cb_cold_7();
LAB_001df663:
    recv_cb_cold_1();
LAB_001df670:
    recv_cb_cold_5();
LAB_001df675:
    recv_cb_cold_2();
LAB_001df682:
    recv_cb_cold_3();
LAB_001df68f:
    recv_cb_cold_4();
  }
  else {
    if (puVar10 != (undefined8 *)0x0) {
      uStack_50 = in_R8 & 0xffffffff;
      puStack_58 = (undefined8 *)0x0;
      if (uStack_50 != 0) goto LAB_001df663;
      if (in_RCX == (undefined4 *)0x0) goto LAB_001df670;
      uStack_50 = 4;
      in_RCX = (undefined4 *)0x4;
      puStack_58 = puVar10;
      if (puVar10 != (undefined8 *)0x4) goto LAB_001df675;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      uStack_50 = (ulong)iVar3;
      puStack_58 = (undefined8 *)0x0;
      ppcVar8 = ppcVar11;
      if (uStack_50 != 0) goto LAB_001df682;
      iVar3 = uv_udp_recv_stop(ppcVar11);
      uStack_50 = (ulong)iVar3;
      puStack_58 = (undefined8 *)0x0;
      if (uStack_50 == 0) {
        uVar4 = uv_close(ppcVar11,close_cb);
        return uVar4;
      }
      goto LAB_001df68f;
    }
    iVar2 = 0;
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  recv_cb_cold_6();
  if (in_RCX == (undefined4 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar2 == 0) {
    send_cb_called = send_cb_called + 1;
    uVar4 = uv_close(*(undefined8 *)(in_RCX + 0x12),close_cb);
    return uVar4;
  }
  send_cb_cold_1();
  pcStack_150 = (code *)0x1df706;
  ppcStack_80 = ppcVar8;
  uVar1 = create_udp_socket();
  pcStack_150 = (code *)0x1df70d;
  uVar5 = create_udp_socket();
  uVar7 = (ulong)uVar5;
  pcStack_150 = (code *)0x1df714;
  uVar6 = uv_default_loop();
  pcStack_150 = (code *)0x1df721;
  iVar2 = uv_udp_init(uVar6,auStack_138);
  lStack_140 = (long)iVar2;
  lStack_148 = 0;
  if (lStack_140 == 0) {
    pcStack_150 = (code *)0x1df74b;
    iVar2 = uv_udp_open(auStack_138,uVar1);
    lStack_140 = (long)iVar2;
    lStack_148 = 0;
    if (lStack_140 != 0) goto LAB_001df83b;
    pcStack_150 = (code *)0x1df775;
    iVar2 = uv_udp_open(auStack_138,uVar5);
    lStack_140 = (long)iVar2;
    lStack_148 = -0x10;
    if (lStack_140 != -0x10) goto LAB_001df848;
    pcStack_150 = (code *)0x1df79a;
    iVar2 = close(uVar5);
    lStack_140 = (long)iVar2;
    lStack_148 = 0;
    if (lStack_140 != 0) goto LAB_001df855;
    pcStack_150 = (code *)0x1df7c4;
    uv_close(auStack_138,0);
    pcStack_150 = (code *)0x1df7c9;
    uVar6 = uv_default_loop();
    pcStack_150 = (code *)0x1df7d3;
    uv_run(uVar6,0);
    pcStack_150 = (code *)0x1df7d8;
    uVar7 = uv_default_loop();
    pcStack_150 = (code *)0x1df7ec;
    uv_walk(uVar7,close_walk_cb,0);
    pcStack_150 = (code *)0x1df7f6;
    uv_run(uVar7,0);
    lStack_140 = 0;
    pcStack_150 = (code *)0x1df804;
    uVar6 = uv_default_loop();
    pcStack_150 = (code *)0x1df80c;
    iVar2 = uv_loop_close(uVar6);
    lStack_148 = (long)iVar2;
    if (lStack_140 == lStack_148) {
      pcStack_150 = (code *)0x1df822;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_150 = (code *)0x1df83b;
    run_test_udp_open_twice_cold_1();
LAB_001df83b:
    pcStack_150 = (code *)0x1df848;
    run_test_udp_open_twice_cold_2();
LAB_001df848:
    pcStack_150 = (code *)0x1df855;
    run_test_udp_open_twice_cold_3();
LAB_001df855:
    pcStack_150 = (code *)0x1df862;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_150 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_238 = (code *)0x1df88d;
  pcStack_150 = (code *)uVar7;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_218);
  alStack_208[0] = (long)iVar2;
  lStack_228 = 0;
  if (alStack_208[0] == 0) {
    pcStack_238 = (code *)0x1df8b2;
    uVar5 = create_udp_socket();
    uVar7 = (ulong)uVar5;
    pcStack_238 = (code *)0x1df8c5;
    iVar2 = bind(uVar5,&sStack_218,0x10);
    alStack_208[0] = (long)iVar2;
    lStack_228 = 0;
    if (alStack_208[0] != 0) goto LAB_001dfa01;
    pcStack_238 = (code *)0x1df8ea;
    uVar6 = uv_default_loop();
    pcStack_238 = (code *)0x1df8f7;
    iVar2 = uv_udp_init(uVar6,alStack_208);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dfa10;
    pcStack_238 = (code *)0x1df923;
    iVar2 = uv_udp_open(alStack_208,uVar5);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dfa1f;
    pcStack_238 = (code *)0x1df95b;
    iVar2 = uv_udp_recv_start(alStack_208,alloc_cb,recv_cb);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dfa2e;
    pcStack_238 = (code *)0x1df987;
    uv_close(alStack_208,0);
    pcStack_238 = (code *)0x1df98c;
    uVar6 = uv_default_loop();
    pcStack_238 = (code *)0x1df996;
    uv_run(uVar6,0);
    pcStack_238 = (code *)0x1df99b;
    uVar7 = uv_default_loop();
    pcStack_238 = (code *)0x1df9af;
    uv_walk(uVar7,close_walk_cb,0);
    pcStack_238 = (code *)0x1df9b9;
    uv_run(uVar7,0);
    lStack_228 = 0;
    pcStack_238 = (code *)0x1df9c7;
    uVar6 = uv_default_loop();
    pcStack_238 = (code *)0x1df9cf;
    iVar2 = uv_loop_close(uVar6);
    lStack_220 = (long)iVar2;
    if (lStack_228 == lStack_220) {
      pcStack_238 = (code *)0x1df9e7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_238 = (code *)0x1dfa01;
    run_test_udp_open_bound_cold_1();
LAB_001dfa01:
    pcStack_238 = (code *)0x1dfa10;
    run_test_udp_open_bound_cold_2();
LAB_001dfa10:
    pcStack_238 = (code *)0x1dfa1f;
    run_test_udp_open_bound_cold_3();
LAB_001dfa1f:
    pcStack_238 = (code *)0x1dfa2e;
    run_test_udp_open_bound_cold_4();
LAB_001dfa2e:
    pcStack_238 = (code *)0x1dfa3d;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_238 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3e0 = (code *)0x1dfa65;
  pcStack_238 = (code *)uVar7;
  auStack_3c8 = uv_buf_init("PING",4);
  pcStack_3e0 = (code *)0x1dfa85;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3b8);
  alStack_2f0[0] = (long)iVar2;
  alStack_3a8[0] = 0;
  if (alStack_2f0[0] == 0) {
    pcStack_3e0 = (code *)0x1dfab0;
    uVar5 = create_udp_socket();
    uVar7 = (ulong)uVar5;
    pcStack_3e0 = (code *)0x1dfab7;
    uVar6 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dfac7;
    iVar2 = uv_udp_init(uVar6,alStack_2f0);
    alStack_3a8[0] = (long)iVar2;
    lStack_3d8 = 0;
    if (alStack_3a8[0] != 0) goto LAB_001dfd05;
    pcStack_3e0 = (code *)0x1dfaf6;
    iVar2 = connect(uVar5,&sStack_3b8,0x10);
    alStack_3a8[0] = (long)iVar2;
    lStack_3d8 = 0;
    if (alStack_3a8[0] != 0) goto LAB_001dfd12;
    pcStack_3e0 = (code *)0x1dfb23;
    iVar2 = uv_udp_open(alStack_2f0,uVar5);
    alStack_3a8[0] = (long)iVar2;
    lStack_3d8 = 0;
    if (alStack_3a8[0] != 0) goto LAB_001dfd1f;
    pcStack_3e0 = (code *)0x1dfb46;
    uVar6 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dfb53;
    iVar2 = uv_udp_init(uVar6,alStack_3a8);
    lStack_3d8 = (long)iVar2;
    lStack_3d0 = 0;
    if (lStack_3d8 != 0) goto LAB_001dfd2c;
    pcStack_3e0 = (code *)0x1dfb82;
    iVar2 = uv_udp_bind(alStack_3a8,&sStack_3b8,0);
    lStack_3d8 = (long)iVar2;
    lStack_3d0 = 0;
    if (lStack_3d8 != 0) goto LAB_001dfd39;
    pcStack_3e0 = (code *)0x1dfbb8;
    iVar2 = uv_udp_recv_start(alStack_3a8,alloc_cb,recv_cb);
    lStack_3d8 = (long)iVar2;
    lStack_3d0 = 0;
    if (lStack_3d8 != 0) goto LAB_001dfd46;
    pcStack_3e0 = (code *)0x1dfbfe;
    iVar2 = uv_udp_send(&send_req,alStack_2f0,auStack_3c8,1,0,send_cb);
    lStack_3d8 = (long)iVar2;
    lStack_3d0 = 0;
    if (lStack_3d8 != 0) goto LAB_001dfd53;
    pcStack_3e0 = (code *)0x1dfc21;
    uVar6 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dfc2b;
    uv_run(uVar6,0);
    lStack_3d8 = 1;
    lStack_3d0 = (long)send_cb_called;
    if (lStack_3d0 != 1) goto LAB_001dfd60;
    lStack_3d8 = 2;
    lStack_3d0 = (long)close_cb_called;
    if (lStack_3d0 != 2) goto LAB_001dfd6d;
    lStack_3d8 = lStack_2b0;
    lStack_3d0 = 0;
    if (lStack_2b0 != 0) goto LAB_001dfd7a;
    pcStack_3e0 = (code *)0x1dfc9a;
    uVar7 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dfcae;
    uv_walk(uVar7,close_walk_cb,0);
    pcStack_3e0 = (code *)0x1dfcb8;
    uv_run(uVar7,0);
    lStack_3d8 = 0;
    pcStack_3e0 = (code *)0x1dfcc5;
    uVar6 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dfccd;
    iVar2 = uv_loop_close(uVar6);
    lStack_3d0 = (long)iVar2;
    if (lStack_3d8 == lStack_3d0) {
      pcStack_3e0 = (code *)0x1dfce8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3e0 = (code *)0x1dfd05;
    run_test_udp_open_connect_cold_1();
LAB_001dfd05:
    pcStack_3e0 = (code *)0x1dfd12;
    run_test_udp_open_connect_cold_2();
LAB_001dfd12:
    pcStack_3e0 = (code *)0x1dfd1f;
    run_test_udp_open_connect_cold_3();
LAB_001dfd1f:
    pcStack_3e0 = (code *)0x1dfd2c;
    run_test_udp_open_connect_cold_4();
LAB_001dfd2c:
    pcStack_3e0 = (code *)0x1dfd39;
    run_test_udp_open_connect_cold_5();
LAB_001dfd39:
    pcStack_3e0 = (code *)0x1dfd46;
    run_test_udp_open_connect_cold_6();
LAB_001dfd46:
    pcStack_3e0 = (code *)0x1dfd53;
    run_test_udp_open_connect_cold_7();
LAB_001dfd53:
    pcStack_3e0 = (code *)0x1dfd60;
    run_test_udp_open_connect_cold_8();
LAB_001dfd60:
    pcStack_3e0 = (code *)0x1dfd6d;
    run_test_udp_open_connect_cold_9();
LAB_001dfd6d:
    pcStack_3e0 = (code *)0x1dfd7a;
    run_test_udp_open_connect_cold_10();
LAB_001dfd7a:
    pcStack_3e0 = (code *)0x1dfd87;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3e0 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_3e8 = uVar7;
  pcStack_3e0 = (code *)(ulong)uVar1;
  auStack_668 = uv_buf_init("PING",4);
  uVar6 = uv_default_loop();
  uStack_63c = 0;
  uStack_634 = 0;
  uStack_62c = 0;
  uStack_624 = 0;
  uStack_61c = 0;
  uStack_614 = 0;
  uStack_60c = 0;
  uStack_604 = 0;
  uStack_5fc = 0;
  uStack_5f8 = 0;
  uStack_5f4 = 0;
  uStack_5f0 = 0;
  auStack_656._0_2_ = 1;
  alStack_530[0] = 0x11;
  auStack_5e8[0] = 0x6c;
  auStack_656[2] = '/';
  auStack_656[3] = 't';
  auStack_656[4] = 'm';
  auStack_656[5] = 'p';
  auStack_656[6] = '/';
  auStack_656[7] = 'u';
  auStack_656[8] = 'v';
  auStack_656[9] = '-';
  auStack_656[10] = 't';
  auStack_656[0xb] = 'e';
  auStack_656[0xc] = 's';
  auStack_656[0xd] = 't';
  auStack_656[0xe] = '-';
  auStack_656[0xf] = 's';
  auStack_656[0x10] = 'o';
  auStack_656[0x11] = 'c';
  uStack_644 = 0x6b;
  iVar2 = socket(1,1,0);
  alStack_530[0] = (long)iVar2;
  auStack_5e8[0] = 0;
  if (alStack_530[0] < 0) {
    auStack_5e8[0] = 0;
    run_test_udp_send_unix_cold_8();
LAB_001e0050:
    run_test_udp_send_unix_cold_2();
LAB_001e0065:
    run_test_udp_send_unix_cold_3();
LAB_001e007a:
    run_test_udp_send_unix_cold_4();
LAB_001e008c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar3 = bind(iVar2,(sockaddr *)auStack_656,0x6e);
    alStack_530[0] = (long)iVar3;
    auStack_5e8[0] = 0;
    if (alStack_530[0] != 0) goto LAB_001e0050;
    iVar3 = listen(iVar2,1);
    alStack_530[0] = (long)iVar3;
    auStack_5e8[0] = 0;
    if (alStack_530[0] != 0) goto LAB_001e0065;
    iVar3 = uv_udp_init(uVar6,auStack_5e8);
    alStack_530[0] = (long)iVar3;
    lStack_678 = 0;
    if (alStack_530[0] != 0) goto LAB_001e007a;
    iVar3 = uv_udp_open(auStack_5e8,iVar2);
    alStack_530[0] = (long)iVar3;
    lStack_678 = 0;
    if (alStack_530[0] != 0) goto LAB_001e008c;
    uv_run(uVar6,0);
    iVar3 = uv_udp_send(alStack_530,auStack_5e8,auStack_668,1,auStack_656,0);
    lStack_678 = (long)iVar3;
    lStack_670 = 0;
    if (lStack_678 == 0) {
      uv_close(auStack_5e8,0);
      uv_run(uVar6,0);
      close(iVar2);
      unlink("/tmp/uv-test-sock");
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      lStack_678 = 0;
      iVar2 = uv_loop_close(uVar6);
      lStack_670 = (long)iVar2;
      if (lStack_678 == lStack_670) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001e00ad;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001e00ad:
  plVar12 = &lStack_678;
  run_test_udp_send_unix_cold_7();
  if (plVar12 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    uVar4 = uv_close(plVar12,0);
    return uVar4;
  }
  return iVar2;
}

Assistant:

static uv_os_sock_t create_udp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}